

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestTest.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_1d0ce::TestCrashingTestsAreReportedAsFailures::
~TestCrashingTestsAreReportedAsFailures(TestCrashingTestsAreReportedAsFailures *this)

{
  TestCrashingTestsAreReportedAsFailures *this_local;
  
  ~TestCrashingTestsAreReportedAsFailures(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(CrashingTestsAreReportedAsFailures)
{
    class CrashingTest : public Test
    {
    public:
        CrashingTest() : Test("crashing") {}
        virtual void RunImpl() const
        {
            reinterpret_cast< void (*)() >(0)();
        }
    };

    TestResults results;
	{
		ScopedCurrentTest scopedResult(results);
		CrashingTest().Run();
	}

	CHECK_EQUAL(1, results.GetFailureCount());
}